

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O3

bool wasm::anon_unknown_0::shapeEq(HeapType a,HeapType b)

{
  pointer pFVar1;
  bool bVar2;
  bool bVar3;
  Shareability SVar4;
  Shareability SVar5;
  HeapTypeKind HVar6;
  HeapTypeKind HVar7;
  Struct *pSVar8;
  Struct *pSVar9;
  pointer pFVar10;
  HeapType a_00;
  HeapType b_00;
  long lVar11;
  ulong uVar12;
  Signature SVar13;
  Signature SVar14;
  HeapType local_60;
  long local_58;
  HeapType local_50;
  long local_48;
  HeapType local_40;
  HeapType a_local;
  HeapType b_local;
  
  local_40.id = a.id;
  a_local = b;
  bVar2 = HeapType::isOpen(&local_40);
  bVar3 = HeapType::isOpen(&a_local);
  if (bVar2 == bVar3) {
    SVar4 = HeapType::getShared(&local_40);
    SVar5 = HeapType::getShared(&a_local);
    if ((SVar5 == Shared) == (SVar4 == Shared)) {
      HVar6 = HeapType::getKind(&local_40);
      HVar7 = HeapType::getKind(&a_local);
      if (HVar6 == HVar7) {
        switch(HVar6) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                             ,0x240);
        case Func:
          SVar13 = HeapType::getSignature(&local_40);
          a_00.id = (uintptr_t)SVar13.results.id;
          SVar14 = HeapType::getSignature(&a_local);
          b_00.id = (uintptr_t)SVar14.results.id;
          bVar2 = shapeEq(SVar13.params.id,SVar14.params.id);
          if (bVar2) {
LAB_00ad615c:
            bVar2 = shapeEq((Type)a_00.id,(Type)b_00.id);
            return bVar2;
          }
          break;
        case Struct:
          pSVar8 = HeapType::getStruct(&local_40);
          pSVar9 = HeapType::getStruct(&a_local);
          pFVar10 = (pSVar8->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pFVar1 = (pSVar8->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if ((long)pFVar1 - (long)pFVar10 ==
              (long)(pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
            if (pFVar1 == pFVar10) {
              return true;
            }
            lVar11 = 8;
            uVar12 = 0;
            while ((pFVar1 = (pSVar9->fields).
                             super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                             super__Vector_impl_data._M_start,
                   *(long *)((long)&(pFVar10->type).id + lVar11) ==
                   *(long *)((long)&(pFVar1->type).id + lVar11) &&
                   (bVar2 = shapeEq((Type)*(uintptr_t *)((long)pFVar10 + lVar11 + -8),
                                    (Type)*(uintptr_t *)((long)pFVar1 + lVar11 + -8)), bVar2))) {
              uVar12 = uVar12 + 1;
              pFVar10 = (pSVar8->fields).
                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar11 = lVar11 + 0x10;
              if ((ulong)((long)(pSVar8->fields).
                                super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pFVar10 >> 4) <=
                  uVar12) {
                return true;
              }
            }
          }
          break;
        case Array:
          HeapType::getArray(&local_60);
          HeapType::getArray(&local_50);
          b_00.id = local_50.id;
          a_00.id = local_60.id;
          if (local_58 == local_48) goto LAB_00ad615c;
          break;
        case Cont:
          handle_unreachable("TODO: cont",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                             ,0x23e);
        }
      }
    }
  }
  return false;
}

Assistant:

bool shapeEq(HeapType a, HeapType b) {
  // Check whether `a` and `b` have the same top-level structure, including the
  // position and identity of any children that are not included as transitions
  // in the DFA, i.e. any children that are not nontrivial references.
  if (a.isOpen() != b.isOpen()) {
    return false;
  }
  if (a.isShared() != b.isShared()) {
    return false;
  }
  auto aKind = a.getKind();
  auto bKind = b.getKind();
  if (aKind != bKind) {
    return false;
  }
  switch (aKind) {
    case HeapTypeKind::Func:
      return shapeEq(a.getSignature(), b.getSignature());
    case HeapTypeKind::Struct:
      return shapeEq(a.getStruct(), b.getStruct());
    case HeapTypeKind::Array:
      return shapeEq(a.getArray(), b.getArray());
    case HeapTypeKind::Cont:
      WASM_UNREACHABLE("TODO: cont");
    case HeapTypeKind::Basic:
      WASM_UNREACHABLE("unexpected kind");
  }
  return false;
}